

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

VertexData<Vertex> * __thiscall
geometrycentral::surface::SurfaceMesh::separateNonmanifoldVertices(SurfaceMesh *this)

{
  Vertex e_00;
  Vertex e_01;
  Vertex e_02;
  Vertex e_03;
  bool bVar1;
  bool bVar2;
  runtime_error *this_00;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> *pEVar3;
  bool *pbVar4;
  reference pvVar5;
  size_t sVar6;
  reference pvVar7;
  long in_RSI;
  VertexData<Vertex> *in_RDI;
  Etype EVar8;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> EVar9;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> EVar10;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> EVar11;
  Halfedge he;
  Vertex targetV;
  Vertex newV;
  Vertex origV;
  size_t iComp;
  Corner c;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2_1;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __begin2_1;
  CornerSet *__range2_1;
  VertexData<bool> baseVertexUsed;
  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  vertexEntries;
  Halfedge heB;
  Halfedge heA;
  Edge e;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2;
  EdgeSet *__range2;
  DisjointSets djSet;
  size_t indMax;
  VertexData<Vertex> *parents;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> *in_stack_fffffffffffffac8;
  SurfaceMesh *in_stack_fffffffffffffad0;
  allocator_type *in_stack_fffffffffffffad8;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>
  *in_stack_fffffffffffffae0;
  size_t in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  ParentMeshT *in_stack_fffffffffffffaf8;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>
  *in_stack_fffffffffffffb00;
  Edge *in_stack_fffffffffffffb18;
  size_t in_stack_fffffffffffffb28;
  DisjointSets *in_stack_fffffffffffffb30;
  Edge *in_stack_fffffffffffffb40;
  ParentMeshT *in_stack_fffffffffffffcd0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_308;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_2f8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_2e8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_2d8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_2c8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_2b8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_2a8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_298;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_288;
  size_type local_278;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_270 [4];
  undefined1 local_230 [24];
  undefined1 *local_218;
  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  local_1c0;
  byte local_1a1;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_1a0;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_190;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_180;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_170;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_160;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_150;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_140;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_130;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_120;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_110;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_100;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_f0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_e0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_d0;
  ParentMeshT *local_c0;
  size_t local_b8;
  undefined1 local_70 [24];
  undefined1 *local_58;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)(in_RSI + 0x2c0);
  DisjointSets::DisjointSets(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  edges(in_stack_fffffffffffffad0);
  local_58 = local_70;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffad0);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffad0);
  do {
    bVar1 = RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                       in_stack_fffffffffffffad0,
                       (RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                       in_stack_fffffffffffffac8);
    if (!bVar1) {
      local_1a1 = 0;
      MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::MeshData
                (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      Vertex::Vertex((Vertex *)0x2387bd);
      ::std::allocator<geometrycentral::surface::Vertex>::allocator
                ((allocator<geometrycentral::surface::Vertex> *)0x2387d4);
      ::std::
      vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>::
      vector((vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
              *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
             in_stack_fffffffffffffae8,(value_type *)in_stack_fffffffffffffae0,
             in_stack_fffffffffffffad8);
      ::std::allocator<geometrycentral::surface::Vertex>::~allocator
                ((allocator<geometrycentral::surface::Vertex> *)0x238808);
      MeshData<geometrycentral::surface::Vertex,_bool>::MeshData
                ((MeshData<geometrycentral::surface::Vertex,_bool> *)in_stack_fffffffffffffb00,
                 in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
      corners(in_stack_fffffffffffffad0);
      local_218 = local_230;
      RangeSetBase<geometrycentral::surface::CornerRangeF>::begin
                ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffad0);
      RangeSetBase<geometrycentral::surface::CornerRangeF>::end
                ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffad0);
      while( true ) {
        bVar1 = RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator!=
                          ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
                           in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
        if (!bVar1) break;
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator*
                          ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)0x2388b3);
        local_270[0] = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (local_270);
        local_278 = DisjointSets::find((DisjointSets *)in_stack_fffffffffffffae0,
                                       (size_t)in_stack_fffffffffffffad8);
        EVar10 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                 Corner::vertex((Corner *)in_stack_fffffffffffffad0);
        local_288 = EVar10;
        pEVar3 = &::std::
                  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                  ::operator[](&local_1c0,local_278)->
                  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
        ;
        Vertex::Vertex((Vertex *)0x238991);
        bVar1 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
                operator==(pEVar3,&local_298);
        if (bVar1) {
          e_00.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
          ._0_7_ = in_stack_fffffffffffffaf0;
          e_00.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = (ParentMeshT *)in_stack_fffffffffffffae8;
          e_00.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
          ._7_1_ = in_stack_fffffffffffffaf7;
          local_2a8 = local_288;
          pbVar4 = MeshData<geometrycentral::surface::Vertex,_bool>::operator[]
                             ((MeshData<geometrycentral::surface::Vertex,_bool> *)
                              in_stack_fffffffffffffae0,e_00);
          if ((*pbVar4 & 1U) == 0) {
            e_02.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind._0_7_ = in_stack_fffffffffffffaf0;
            e_02.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh = (ParentMeshT *)in_stack_fffffffffffffae8;
            e_02.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind._7_1_ = in_stack_fffffffffffffaf7;
            local_2d8 = local_288;
            pEVar3 = &MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::
                      operator[](in_stack_fffffffffffffae0,e_02)->
                      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
            ;
            *pEVar3 = local_288;
            pEVar3 = &::std::
                      vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                      ::operator[](&local_1c0,local_278)->
                      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
            ;
            *pEVar3 = local_288;
            e_03.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind._0_7_ = in_stack_fffffffffffffaf0;
            e_03.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh = (ParentMeshT *)in_stack_fffffffffffffae8;
            e_03.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind._7_1_ = in_stack_fffffffffffffaf7;
            local_2e8 = local_288;
            pbVar4 = MeshData<geometrycentral::surface::Vertex,_bool>::operator[]
                               ((MeshData<geometrycentral::surface::Vertex,_bool> *)
                                in_stack_fffffffffffffae0,e_03);
            *pbVar4 = true;
          }
          else {
            EVar10 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                      )getNewVertex((SurfaceMesh *)
                                    CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
            local_2b8 = EVar10;
            pEVar3 = &::std::
                      vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                      ::operator[](&local_1c0,local_278)->
                      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
            ;
            *pEVar3 = local_2b8;
            e_01.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind._0_7_ = in_stack_fffffffffffffaf0;
            e_01.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh = (ParentMeshT *)in_stack_fffffffffffffae8;
            e_01.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind._7_1_ = in_stack_fffffffffffffaf7;
            local_2c8 = local_2b8;
            pEVar3 = &MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::
                      operator[](in_stack_fffffffffffffae0,e_01)->
                      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
            ;
            *pEVar3 = local_288;
          }
        }
        pvVar5 = ::std::
                 vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                 ::operator[](&local_1c0,local_278);
        local_2f8.mesh =
             (pvVar5->
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
             .mesh;
        local_2f8.ind =
             (pvVar5->
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
             .ind;
        EVar11 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Corner::halfedge((Corner *)0x238bff);
        local_308 = EVar11;
        sVar6 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
                getIndex(&local_2f8);
        in_stack_fffffffffffffaf0 = (undefined7)sVar6;
        in_stack_fffffffffffffaf7 = (undefined1)(sVar6 >> 0x38);
        in_stack_fffffffffffffae0 =
             (MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex> *)
             (in_RSI + 0x110);
        in_stack_fffffffffffffae8 =
             Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
             getIndex(&local_308);
        pvVar7 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffae0,in_stack_fffffffffffffae8);
        *pvVar7 = CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0);
        in_stack_fffffffffffffad8 =
             (allocator_type *)
             Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
             getIndex(&local_308);
        in_stack_fffffffffffffac8 =
             (RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)(in_RSI + 0x140);
        in_stack_fffffffffffffad0 =
             (SurfaceMesh *)
             Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
             getIndex(&local_2f8);
        pvVar7 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffac8,(size_type)in_stack_fffffffffffffad0);
        *pvVar7 = (value_type)in_stack_fffffffffffffad8;
        RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++
                  ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
                   in_stack_fffffffffffffad0);
      }
      initializeHalfedgeNeighbors(in_stack_fffffffffffffcd0);
      *(long *)(in_RSI + 0x2e8) = *(long *)(in_RSI + 0x2e8) + 1;
      local_1a1 = 1;
      MeshData<geometrycentral::surface::Vertex,_bool>::~MeshData
                ((MeshData<geometrycentral::surface::Vertex,_bool> *)in_stack_fffffffffffffad0);
      ::std::
      vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>::
      ~vector((vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
               *)in_stack_fffffffffffffae0);
      if ((local_1a1 & 1) == 0) {
        MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::~MeshData
                  ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex> *)
                   in_stack_fffffffffffffad0);
      }
      DisjointSets::~DisjointSets((DisjointSets *)in_stack_fffffffffffffad0);
      return in_RDI;
    }
    EVar8 = RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator*
                      ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)0x238160);
    local_b8 = EVar8.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
               ind;
    in_stack_fffffffffffffcd0 =
         EVar8.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
         mesh;
    local_c0 = in_stack_fffffffffffffcd0;
    bVar1 = Edge::isBoundary(in_stack_fffffffffffffb18);
    if (!bVar1) {
      bVar1 = Edge::isManifold(in_stack_fffffffffffffb40);
      if (!bVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (this_00,"mesh must be edge-manifold for separateNonmanifoldVertices()");
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      EVar11 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Edge::halfedge((Edge *)in_stack_fffffffffffffad0);
      local_d0 = EVar11;
      EVar11 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::sibling((Halfedge *)in_stack_fffffffffffffad0);
      local_e0 = EVar11;
      bVar1 = Halfedge::orientation((Halfedge *)0x2382ed);
      bVar2 = Halfedge::orientation((Halfedge *)0x238317);
      if (bVar1 == bVar2) {
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x238349);
        local_f0 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_f0);
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x23839f);
        local_100 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_100);
        DisjointSets::merge((DisjointSets *)in_stack_fffffffffffffb00,
                            (size_t)in_stack_fffffffffffffaf8,
                            CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
        EVar11 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Halfedge::next((Halfedge *)in_stack_fffffffffffffad0);
        local_120 = EVar11;
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x238453);
        local_110 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_110);
        EVar11 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Halfedge::next((Halfedge *)in_stack_fffffffffffffad0);
        local_140 = EVar11;
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x2384e8);
        local_130 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_130);
        DisjointSets::merge((DisjointSets *)in_stack_fffffffffffffb00,
                            (size_t)in_stack_fffffffffffffaf8,
                            CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      }
      else {
        EVar11 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Halfedge::next((Halfedge *)in_stack_fffffffffffffad0);
        local_160 = EVar11;
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x2385a1);
        local_150 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_150);
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x2385f7);
        local_170 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_170);
        DisjointSets::merge((DisjointSets *)in_stack_fffffffffffffb00,
                            (size_t)in_stack_fffffffffffffaf8,
                            CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x23866c);
        local_180 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_180);
        EVar11 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Halfedge::next((Halfedge *)in_stack_fffffffffffffad0);
        local_1a0 = EVar11;
        EVar9 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::corner((Halfedge *)0x238701);
        local_190 = EVar9;
        Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>::getIndex
                  (&local_190);
        DisjointSets::merge((DisjointSets *)in_stack_fffffffffffffb00,
                            (size_t)in_stack_fffffffffffffaf8,
                            CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      }
    }
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffad0)
    ;
  } while( true );
}

Assistant:

VertexData<Vertex> SurfaceMesh::separateNonmanifoldVertices() {

  // Find edge-connected sets of corners
  size_t indMax = nHalfedgesFillCount;
  DisjointSets djSet(indMax);
  for (Edge e : edges()) {
    if (e.isBoundary()) continue;
    if (!e.isManifold()) {
      throw std::runtime_error("mesh must be edge-manifold for separateNonmanifoldVertices()");
    }
    Halfedge heA = e.halfedge();
    Halfedge heB = heA.sibling();

    if (heA.orientation() == heB.orientation()) {
      djSet.merge(heA.corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.next().corner().getIndex(), heB.next().corner().getIndex());
    } else {
      djSet.merge(heA.next().corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.corner().getIndex(), heB.next().corner().getIndex());
    }
  }

  // Make sure there is a distinct vertex entry for each component
  VertexData<Vertex> parents(*this);
  std::vector<Vertex> vertexEntries(indMax, Vertex());
  VertexData<bool> baseVertexUsed(*this, false);
  for (Corner c : corners()) {
    size_t iComp = djSet.find(c.getIndex());
    Vertex origV = c.vertex();

    // create vertex if needed
    if (vertexEntries[iComp] == Vertex()) {
      if (baseVertexUsed[origV]) {
        Vertex newV = getNewVertex();
        vertexEntries[iComp] = newV;
        parents[newV] = origV;
      } else {
        parents[origV] = origV;
        vertexEntries[iComp] = origV;
        baseVertexUsed[origV] = true;
      }
    }

    // hook up
    Vertex targetV = vertexEntries[iComp];
    Halfedge he = c.halfedge();
    heVertexArr[he.getIndex()] = targetV.getIndex();
    vHalfedgeArr[targetV.getIndex()] = he.getIndex();
  }

  // just rebuild these from scratch, rather than trying to maintain
  initializeHalfedgeNeighbors();

  modificationTick++;
  return parents;
}